

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
trieste::SourceDef::linecol(SourceDef *this,size_t pos)

{
  ulong *puVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  puVar1 = (this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  puVar4 = puVar1;
  if ((long)uVar2 < 1) {
    pVar6.first = 0;
  }
  else {
    do {
      uVar5 = uVar2 >> 1;
      uVar2 = ~uVar5 + uVar2;
      puVar3 = puVar4 + uVar5 + 1;
      if (pos <= puVar4[uVar5]) {
        uVar2 = uVar5;
        puVar3 = puVar4;
      }
      puVar4 = puVar3;
    } while (0 < (long)uVar2);
    pVar6.first = (long)puVar3 - (long)puVar1 >> 3;
    if (puVar3 != puVar1) {
      pVar6.second = pos + ~puVar3[-1];
      return pVar6;
    }
  }
  pVar7.second = pos;
  pVar7.first = pVar6.first;
  return pVar7;
}

Assistant:

std::pair<size_t, size_t> linecol(size_t pos) const
    {
      // Lines and columns are 0-indexed.
      auto it = std::lower_bound(lines.begin(), lines.end(), pos);

      auto line = it - lines.begin();
      auto col = pos;

      if (it != lines.begin())
        col -= *(it - 1) + 1;

      return {line, col};
    }